

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> *field)

{
  Var *local_28;
  _Head_base<0UL,_wabt::StartModuleField_*,_false> local_20;
  
  local_28 = &((field->_M_t).
               super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>
               .super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl)->start;
  std::vector<wabt::Var*,std::allocator<wabt::Var*>>::emplace_back<wabt::Var*>
            ((vector<wabt::Var*,std::allocator<wabt::Var*>> *)&this->starts,&local_28);
  local_20._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>.
       _M_t.
       super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>
       .super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>.
  super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl = (StartModuleField *)0x0;
  intrusive_list<wabt::ModuleField>::push_back
            (&this->fields,
             (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_20);
  if (local_20._M_head_impl != (StartModuleField *)0x0) {
    (*((local_20._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<StartModuleField> field) {
  starts.push_back(&field->start);
  fields.push_back(std::move(field));
}